

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  uchar uVar5;
  uchar uVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar7 = 1;
  for (pbVar3 = (byte *)(zSpan + 1); (pbVar3[-1] != 0 && (pbVar3[-1] != 0x2e)); pbVar3 = pbVar3 + 1)
  {
    uVar7 = uVar7 + 1;
  }
  if (zDb == (char *)0x0) {
LAB_0019b953:
    uVar7 = 1;
    pbVar8 = pbVar3;
    while( true ) {
      pbVar4 = pbVar8 + 1;
      if ((*pbVar8 == 0) || (*pbVar8 == 0x2e)) break;
      uVar7 = uVar7 + 1;
      pbVar8 = pbVar4;
    }
    if (zTab != (char *)0x0) {
      if (uVar7 != 1) {
        uVar10 = uVar7 & 0xffffffff;
        pbVar8 = (byte *)zTab;
        do {
          if ((ulong)*pbVar3 == 0) {
            uVar6 = ""[*pbVar8];
            uVar5 = '\0';
LAB_0019b9c3:
            if (uVar5 != uVar6) goto LAB_0019b9d2;
            break;
          }
          uVar5 = ""[*pbVar3];
          uVar6 = ""[*pbVar8];
          if (uVar5 != uVar6) goto LAB_0019b9c3;
          pbVar3 = pbVar3 + 1;
          pbVar8 = pbVar8 + 1;
          uVar11 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar11;
        } while (1 < uVar11);
      }
      if (zTab[uVar7 - 1] != '\0') goto LAB_0019b9d2;
    }
    iVar2 = 1;
    if (zCol != (char *)0x0) {
      do {
        bVar1 = *pbVar4;
        if (bVar1 == *zCol) {
          if ((ulong)bVar1 == 0) {
            return 1;
          }
        }
        else if (""[bVar1] != ""[(byte)*zCol]) goto LAB_0019b9d2;
        zCol = (char *)((byte *)zCol + 1);
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
  }
  else {
    if (uVar7 != 1) {
      lVar9 = 0;
      uVar10 = uVar7 & 0xffffffff;
      do {
        if ((ulong)(byte)zSpan[lVar9] == 0) {
          uVar6 = ""[(byte)zDb[lVar9]];
          uVar5 = '\0';
LAB_0019b93f:
          if (uVar5 != uVar6) goto LAB_0019b9d2;
          break;
        }
        uVar5 = ""[(byte)zSpan[lVar9]];
        uVar6 = ""[(byte)zDb[lVar9]];
        if (uVar5 != uVar6) goto LAB_0019b93f;
        uVar11 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar11;
        lVar9 = lVar9 + 1;
      } while (1 < uVar11);
    }
    if (zDb[uVar7 - 1] == '\0') goto LAB_0019b953;
LAB_0019b9d2:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}